

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqCommsSS::initializeBrokerConnections
          (ZmqCommsSS *this,socket_t *brokerSocket,socket_t *brokerConnection)

{
  string *address;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string_view message;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    local_80._M_dataplus._M_p._0_4_ = 500;
    zmq::detail::socket_base::setsockopt<int>
              (&brokerSocket->super_socket_base,0x11,(int *)&local_80);
    address = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    psVar3 = address;
    bVar1 = bindzmqSocket(brokerSocket,address,
                          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>.
                          _M_i,(milliseconds)
                               (this->super_NetworkCommsInterface).super_CommsInterface.
                               connectionTimeout.__r,(milliseconds)0xc8);
    if (bVar1) goto LAB_0022678e;
    zmq::socket_t::close(brokerSocket,(int)psVar3);
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unable to bind zmq router socket giving up ",&local_81);
    gmlc::networking::makePortAddress
              (&local_60,address,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    std::operator+(&local_80,&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
    message._M_str._4_4_ = local_80._M_dataplus._M_p._4_4_;
    message._M_str._0_4_ = local_80._M_dataplus._M_p._0_4_;
    message._M_len = local_80._M_string_length;
    CommsInterface::logError((CommsInterface *)this,message);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
LAB_0022683a:
    iVar2 = -1;
  }
  else {
LAB_0022678e:
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      iVar2 = initializeConnectionToBroker(this,brokerConnection);
      if (iVar2 != 0) goto LAB_0022683a;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ZmqCommsSS::initializeBrokerConnections(zmq::socket_t& brokerSocket,
                                            zmq::socket_t& brokerConnection)
{
    if (serverMode) {
        brokerSocket.setsockopt(ZMQ_LINGER, 500);
        auto bindsuccess =
            bindzmqSocket(brokerSocket, localTargetAddress, PortNumber, connectionTimeout);
        if (!bindsuccess) {
            brokerSocket.close();
            disconnecting = true;
            logError(std::string("Unable to bind zmq router socket giving up ") +
                     gmlc::networking::makePortAddress(localTargetAddress, PortNumber));
            setRxStatus(ConnectionStatus::ERRORED);
            return -1;
        }
    }
    if (hasBroker) {
        auto ret = initializeConnectionToBroker(brokerConnection);
        if (ret != 0) {
            return ret;
        }
    }
    return 0;
}